

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

void __thiscall
ON_BrepRegionTopology::ON_BrepRegionTopology(ON_BrepRegionTopology *this,ON_BrepRegionTopology *src)

{
  int iVar1;
  ON_BrepFaceSide *pOVar2;
  ON_BrepRegion *pOVar3;
  int local_28;
  int i;
  ON_BrepRegionTopology *src_local;
  ON_BrepRegionTopology *this_local;
  
  ON_BrepFaceSideArray::ON_BrepFaceSideArray(&this->m_FS);
  ON_BrepRegionArray::ON_BrepRegionArray(&this->m_R);
  this->m_brep = (ON_Brep *)0x0;
  this->m_brep = (ON_Brep *)0x0;
  ON_BrepFaceSideArray::operator=(&this->m_FS,&src->m_FS);
  ON_BrepRegionArray::operator=(&this->m_R,&src->m_R);
  local_28 = 0;
  while( true ) {
    iVar1 = ON_ClassArray<ON_BrepFaceSide>::Count((ON_ClassArray<ON_BrepFaceSide> *)this);
    if (iVar1 <= local_28) break;
    pOVar2 = ON_ClassArray<ON_BrepFaceSide>::operator[]
                       ((ON_ClassArray<ON_BrepFaceSide> *)this,local_28);
    pOVar2->m_rtop = this;
    local_28 = local_28 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar1 = ON_ClassArray<ON_BrepRegion>::Count((ON_ClassArray<ON_BrepRegion> *)&this->m_R);
    if (iVar1 <= local_28) break;
    pOVar3 = ON_ClassArray<ON_BrepRegion>::operator[]
                       ((ON_ClassArray<ON_BrepRegion> *)&this->m_R,local_28);
    pOVar3->m_rtop = this;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

ON_BrepRegionTopology::ON_BrepRegionTopology(const ON_BrepRegionTopology& src)
{
  int i;
  // do not copy m_brep
  m_brep = 0;
  m_FS = src.m_FS;
  m_R = src.m_R;
  for (i = 0; i < m_FS.Count(); i++ )
    m_FS[i].m_rtop = this;
  for (i = 0; i < m_R.Count(); i++ )
    m_R[i].m_rtop = this;
}